

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O2

void __thiscall
cmGraphVizWriter::ReadSettings
          (cmGraphVizWriter *this,char *settingsFileName,char *fallbackSettingsFileName)

{
  cmMakefile *this_00;
  Snapshot snapshot;
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  pointer pbVar4;
  string ignoreTargetsRegexes;
  RegularExpression currentRegex;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ignoreTargetsRegExVector;
  string currentRegexString;
  cmake cm;
  cmGlobalGenerator ggi;
  string local_9a0;
  cmLocalGenerator *local_980;
  RegularExpression local_978;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_8a8;
  char *local_890 [4];
  Snapshot local_870;
  cmake local_858;
  cmGlobalGenerator local_5f8;
  
  cmake::cmake(&local_858);
  std::__cxx11::string::string((string *)&local_5f8,"",(allocator *)&local_978);
  cmake::SetHomeDirectory(&local_858,(string *)&local_5f8);
  std::__cxx11::string::~string((string *)&local_5f8);
  std::__cxx11::string::string((string *)&local_5f8,"",(allocator *)&local_978);
  cmake::SetHomeOutputDirectory(&local_858,(string *)&local_5f8);
  std::__cxx11::string::~string((string *)&local_5f8);
  cmGlobalGenerator::cmGlobalGenerator(&local_5f8,&local_858);
  cmState::Snapshot::Snapshot(&local_870,(cmState *)0x0,(PositionType)ZEXT816(0));
  snapshot.Position.Tree = local_870.Position.Tree;
  snapshot.State = local_870.State;
  snapshot.Position.Position = local_870.Position.Position;
  local_980 = cmGlobalGenerator::MakeLocalGenerator(&local_5f8,snapshot,(cmLocalGenerator *)0x0);
  this_00 = local_980->Makefile;
  bVar1 = cmsys::SystemTools::FileExists(settingsFileName);
  if (bVar1) {
LAB_003b8903:
    bVar1 = cmMakefile::ReadListFile(this_00,settingsFileName);
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Reading GraphViz options file: ");
      poVar2 = std::operator<<(poVar2,settingsFileName);
      std::endl<char,std::char_traits<char>>(poVar2);
      std::__cxx11::string::string
                ((string *)&local_978,"GRAPHVIZ_GRAPH_TYPE",(allocator *)&local_9a0);
      pcVar3 = cmMakefile::GetDefinition(this_00,(string *)&local_978);
      std::__cxx11::string::~string((string *)&local_978);
      if (pcVar3 != (char *)0x0) {
        std::__cxx11::string::assign((char *)this);
      }
      std::__cxx11::string::string
                ((string *)&local_978,"GRAPHVIZ_GRAPH_NAME",(allocator *)&local_9a0);
      pcVar3 = cmMakefile::GetDefinition(this_00,(string *)&local_978);
      std::__cxx11::string::~string((string *)&local_978);
      if (pcVar3 != (char *)0x0) {
        std::__cxx11::string::assign((char *)&this->GraphName);
      }
      std::__cxx11::string::string
                ((string *)&local_978,"GRAPHVIZ_GRAPH_HEADER",(allocator *)&local_9a0);
      pcVar3 = cmMakefile::GetDefinition(this_00,(string *)&local_978);
      std::__cxx11::string::~string((string *)&local_978);
      if (pcVar3 != (char *)0x0) {
        std::__cxx11::string::assign((char *)&this->GraphHeader);
      }
      std::__cxx11::string::string
                ((string *)&local_978,"GRAPHVIZ_NODE_PREFIX",(allocator *)&local_9a0);
      pcVar3 = cmMakefile::GetDefinition(this_00,(string *)&local_978);
      std::__cxx11::string::~string((string *)&local_978);
      if (pcVar3 != (char *)0x0) {
        std::__cxx11::string::assign((char *)&this->GraphNodePrefix);
      }
      std::__cxx11::string::string
                ((string *)&local_978,"GRAPHVIZ_EXECUTABLES",(allocator *)&local_9a0);
      pcVar3 = cmMakefile::GetDefinition(this_00,(string *)&local_978);
      std::__cxx11::string::~string((string *)&local_978);
      if (pcVar3 != (char *)0x0) {
        std::__cxx11::string::string
                  ((string *)&local_978,"GRAPHVIZ_EXECUTABLES",(allocator *)&local_9a0);
        bVar1 = cmMakefile::IsOn(this_00,(string *)&local_978);
        this->GenerateForExecutables = bVar1;
        std::__cxx11::string::~string((string *)&local_978);
      }
      std::__cxx11::string::string
                ((string *)&local_978,"GRAPHVIZ_STATIC_LIBS",(allocator *)&local_9a0);
      pcVar3 = cmMakefile::GetDefinition(this_00,(string *)&local_978);
      std::__cxx11::string::~string((string *)&local_978);
      if (pcVar3 != (char *)0x0) {
        std::__cxx11::string::string
                  ((string *)&local_978,"GRAPHVIZ_STATIC_LIBS",(allocator *)&local_9a0);
        bVar1 = cmMakefile::IsOn(this_00,(string *)&local_978);
        this->GenerateForStaticLibs = bVar1;
        std::__cxx11::string::~string((string *)&local_978);
      }
      std::__cxx11::string::string
                ((string *)&local_978,"GRAPHVIZ_SHARED_LIBS",(allocator *)&local_9a0);
      pcVar3 = cmMakefile::GetDefinition(this_00,(string *)&local_978);
      std::__cxx11::string::~string((string *)&local_978);
      if (pcVar3 != (char *)0x0) {
        std::__cxx11::string::string
                  ((string *)&local_978,"GRAPHVIZ_SHARED_LIBS",(allocator *)&local_9a0);
        bVar1 = cmMakefile::IsOn(this_00,(string *)&local_978);
        this->GenerateForSharedLibs = bVar1;
        std::__cxx11::string::~string((string *)&local_978);
      }
      std::__cxx11::string::string
                ((string *)&local_978,"GRAPHVIZ_MODULE_LIBS",(allocator *)&local_9a0);
      pcVar3 = cmMakefile::GetDefinition(this_00,(string *)&local_978);
      std::__cxx11::string::~string((string *)&local_978);
      if (pcVar3 != (char *)0x0) {
        std::__cxx11::string::string
                  ((string *)&local_978,"GRAPHVIZ_MODULE_LIBS",(allocator *)&local_9a0);
        bVar1 = cmMakefile::IsOn(this_00,(string *)&local_978);
        this->GenerateForModuleLibs = bVar1;
        std::__cxx11::string::~string((string *)&local_978);
      }
      std::__cxx11::string::string
                ((string *)&local_978,"GRAPHVIZ_EXTERNAL_LIBS",(allocator *)&local_9a0);
      pcVar3 = cmMakefile::GetDefinition(this_00,(string *)&local_978);
      std::__cxx11::string::~string((string *)&local_978);
      if (pcVar3 != (char *)0x0) {
        std::__cxx11::string::string
                  ((string *)&local_978,"GRAPHVIZ_EXTERNAL_LIBS",(allocator *)&local_9a0);
        bVar1 = cmMakefile::IsOn(this_00,(string *)&local_978);
        this->GenerateForExternals = bVar1;
        std::__cxx11::string::~string((string *)&local_978);
      }
      std::__cxx11::string::string
                ((string *)&local_978,"GRAPHVIZ_GENERATE_PER_TARGET",(allocator *)&local_9a0);
      pcVar3 = cmMakefile::GetDefinition(this_00,(string *)&local_978);
      std::__cxx11::string::~string((string *)&local_978);
      if (pcVar3 != (char *)0x0) {
        std::__cxx11::string::string
                  ((string *)&local_978,"GRAPHVIZ_GENERATE_PER_TARGET",(allocator *)&local_9a0);
        bVar1 = cmMakefile::IsOn(this_00,(string *)&local_978);
        this->GeneratePerTarget = bVar1;
        std::__cxx11::string::~string((string *)&local_978);
      }
      std::__cxx11::string::string
                ((string *)&local_978,"GRAPHVIZ_GENERATE_DEPENDERS",(allocator *)&local_9a0);
      pcVar3 = cmMakefile::GetDefinition(this_00,(string *)&local_978);
      std::__cxx11::string::~string((string *)&local_978);
      if (pcVar3 != (char *)0x0) {
        std::__cxx11::string::string
                  ((string *)&local_978,"GRAPHVIZ_GENERATE_DEPENDERS",(allocator *)&local_9a0);
        bVar1 = cmMakefile::IsOn(this_00,(string *)&local_978);
        this->GenerateDependers = bVar1;
        std::__cxx11::string::~string((string *)&local_978);
      }
      local_9a0._M_dataplus._M_p = (pointer)&local_9a0.field_2;
      local_9a0._M_string_length = 0;
      local_9a0.field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::string
                ((string *)&local_978,"GRAPHVIZ_IGNORE_TARGETS",(allocator *)local_890);
      pcVar3 = cmMakefile::GetDefinition(this_00,(string *)&local_978);
      std::__cxx11::string::~string((string *)&local_978);
      if (pcVar3 != (char *)0x0) {
        std::__cxx11::string::assign((char *)&local_9a0);
      }
      std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::clear
                (&this->TargetsToIgnoreRegex);
      if (local_9a0._M_string_length != 0) {
        local_8a8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_8a8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_8a8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        cmSystemTools::ExpandListArgument(&local_9a0,&local_8a8,false);
        for (pbVar4 = local_8a8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pbVar4 != local_8a8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish; pbVar4 = pbVar4 + 1) {
          std::__cxx11::string::string((string *)local_890,(string *)pbVar4);
          local_978.program = (char *)0x0;
          bVar1 = cmsys::RegularExpression::compile(&local_978,local_890[0]);
          if (!bVar1) {
            poVar2 = std::operator<<((ostream *)&std::cerr,"Could not compile bad regex \"");
            poVar2 = std::operator<<(poVar2,(string *)local_890);
            poVar2 = std::operator<<(poVar2,"\"");
            std::endl<char,std::char_traits<char>>(poVar2);
          }
          std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::
          push_back(&this->TargetsToIgnoreRegex,&local_978);
          cmsys::RegularExpression::~RegularExpression(&local_978);
          std::__cxx11::string::~string((string *)local_890);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_8a8);
      }
      std::__cxx11::string::~string((string *)&local_9a0);
      if (local_980 == (cmLocalGenerator *)0x0) goto LAB_003b8e97;
    }
    else {
      cmSystemTools::Error
                ("Problem opening GraphViz options file: ",settingsFileName,(char *)0x0,(char *)0x0)
      ;
    }
  }
  else {
    bVar1 = cmsys::SystemTools::FileExists(fallbackSettingsFileName);
    settingsFileName = fallbackSettingsFileName;
    if (bVar1) goto LAB_003b8903;
  }
  (*local_980->_vptr_cmLocalGenerator[1])();
LAB_003b8e97:
  cmGlobalGenerator::~cmGlobalGenerator(&local_5f8);
  cmake::~cmake(&local_858);
  return;
}

Assistant:

void cmGraphVizWriter::ReadSettings(const char* settingsFileName,
                                    const char* fallbackSettingsFileName)
{
  cmake cm;
  cm.SetHomeDirectory("");
  cm.SetHomeOutputDirectory("");
  cmGlobalGenerator ggi(&cm);
  cmsys::auto_ptr<cmLocalGenerator> lg(ggi.MakeLocalGenerator());
  cmMakefile *mf = lg->GetMakefile();

  const char* inFileName = settingsFileName;

  if ( !cmSystemTools::FileExists(inFileName) )
    {
    inFileName = fallbackSettingsFileName;
    if ( !cmSystemTools::FileExists(inFileName) )
      {
      return;
      }
    }

  if ( !mf->ReadListFile(inFileName) )
    {
    cmSystemTools::Error("Problem opening GraphViz options file: ",
                         inFileName);
    return;
    }

  std::cout << "Reading GraphViz options file: " << inFileName << std::endl;

#define __set_if_set(var, cmakeDefinition) \
  { \
  const char* value = mf->GetDefinition(cmakeDefinition); \
  if ( value ) \
    { \
    var = value; \
    } \
  }

  __set_if_set(this->GraphType, "GRAPHVIZ_GRAPH_TYPE");
  __set_if_set(this->GraphName, "GRAPHVIZ_GRAPH_NAME");
  __set_if_set(this->GraphHeader, "GRAPHVIZ_GRAPH_HEADER");
  __set_if_set(this->GraphNodePrefix, "GRAPHVIZ_NODE_PREFIX");

#define __set_bool_if_set(var, cmakeDefinition) \
  { \
  const char* value = mf->GetDefinition(cmakeDefinition); \
  if ( value ) \
    { \
    var = mf->IsOn(cmakeDefinition); \
    } \
  }

  __set_bool_if_set(this->GenerateForExecutables, "GRAPHVIZ_EXECUTABLES");
  __set_bool_if_set(this->GenerateForStaticLibs, "GRAPHVIZ_STATIC_LIBS");
  __set_bool_if_set(this->GenerateForSharedLibs, "GRAPHVIZ_SHARED_LIBS");
  __set_bool_if_set(this->GenerateForModuleLibs, "GRAPHVIZ_MODULE_LIBS");
  __set_bool_if_set(this->GenerateForExternals, "GRAPHVIZ_EXTERNAL_LIBS");
  __set_bool_if_set(this->GeneratePerTarget, "GRAPHVIZ_GENERATE_PER_TARGET");
  __set_bool_if_set(this->GenerateDependers, "GRAPHVIZ_GENERATE_DEPENDERS");

  std::string ignoreTargetsRegexes;
  __set_if_set(ignoreTargetsRegexes, "GRAPHVIZ_IGNORE_TARGETS");

  this->TargetsToIgnoreRegex.clear();
  if (!ignoreTargetsRegexes.empty())
    {
    std::vector<std::string> ignoreTargetsRegExVector;
    cmSystemTools::ExpandListArgument(ignoreTargetsRegexes,
                                      ignoreTargetsRegExVector);
    for(std::vector<std::string>::const_iterator itvIt
                                            = ignoreTargetsRegExVector.begin();
        itvIt != ignoreTargetsRegExVector.end();
        ++ itvIt )
      {
      std::string currentRegexString(*itvIt);
      cmsys::RegularExpression currentRegex;
      if (!currentRegex.compile(currentRegexString.c_str()))
        {
        std::cerr << "Could not compile bad regex \"" << currentRegexString
                  << "\"" << std::endl;
        }
      this->TargetsToIgnoreRegex.push_back(currentRegex);
      }
    }

}